

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaLookups.cpp
# Opt level: O0

void testToLinear(void)

{
  float fVar1;
  double dVar2;
  undefined4 extraout_XMM0_Db;
  double dVar3;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  int i_1;
  char *tmp;
  float logBase;
  float sign;
  half h;
  int i;
  unsigned_short toLinear [65536];
  undefined4 in_stack_fffffffffffdffcc;
  undefined4 in_stack_fffffffffffdffd0;
  undefined4 in_stack_fffffffffffdffd4;
  int iVar4;
  undefined2 *in_stack_fffffffffffdffd8;
  float f;
  undefined4 in_stack_fffffffffffdffe0;
  undefined2 in_stack_fffffffffffdffe4;
  undefined2 in_stack_fffffffffffdffe6;
  undefined4 uStack_20014;
  half hStack_2000e;
  uint uStack_2000c;
  undefined2 auStack_20008 [65540];
  
  for (uStack_2000c = 1; (int)uStack_2000c < 0x10000; uStack_2000c = uStack_2000c + 1) {
    dVar2 = pow(2.7182818,2.2);
    f = (float)((ulong)in_stack_fffffffffffdffd8 >> 0x20);
    if ((uStack_2000c & 0x7c00) == 0x7c00) {
      auStack_20008[(int)uStack_2000c] = 0;
    }
    else {
      half::setBits(&hStack_2000e,(unsigned_short)uStack_2000c);
      uStack_20014 = 0x3f800000;
      fVar1 = half::operator_cast_to_float(&hStack_2000e);
      if (fVar1 < 0.0) {
        uStack_20014 = 0xbf800000;
      }
      fVar1 = half::operator_cast_to_float(&hStack_2000e);
      dVar3 = std::fabs((double)CONCAT44(extraout_XMM0_Db,fVar1));
      if (1.0 < SUB84(dVar3,0)) {
        fVar1 = half::operator_cast_to_float(&hStack_2000e);
        dVar3 = std::fabs((double)CONCAT44(extraout_XMM0_Db_01,fVar1));
        dVar3 = (double)SUB84(dVar3,0) - 1.0;
        std::pow((double)(ulong)(uint)(float)dVar2,
                 (double)CONCAT44((int)((ulong)dVar3 >> 0x20),(float)dVar3));
        half::half((half *)CONCAT26(in_stack_fffffffffffdffe6,
                                    CONCAT24(in_stack_fffffffffffdffe4,in_stack_fffffffffffdffe0)),f
                  );
        in_stack_fffffffffffdffcc = uStack_20014;
      }
      else {
        fVar1 = half::operator_cast_to_float(&hStack_2000e);
        dVar2 = std::fabs((double)CONCAT44(extraout_XMM0_Db_00,fVar1));
        std::pow(dVar2,5.30913400143054e-315);
        half::half((half *)CONCAT26(in_stack_fffffffffffdffe6,
                                    CONCAT24(in_stack_fffffffffffdffe4,in_stack_fffffffffffdffe0)),f
                  );
        in_stack_fffffffffffdffd0 = uStack_20014;
      }
      in_stack_fffffffffffdffd8 = auStack_20008 + (int)uStack_2000c;
      half::bits(&hStack_2000e);
      Imf_2_5::Xdr::write<Imf_2_5::CharPtrIO,char*>
                ((char **)CONCAT44(in_stack_fffffffffffdffd4,in_stack_fffffffffffdffd0),
                 (unsigned_short)((uint)in_stack_fffffffffffdffcc >> 0x10));
    }
  }
  printf("test dwaCompressorToLinear[]\n");
  for (iVar4 = 0; iVar4 < 0x10000; iVar4 = iVar4 + 1) {
  }
  return;
}

Assistant:

void
testToLinear()
{
    unsigned short toLinear[65536];

    toLinear[0] = 0;

    for (int i=1; i<65536; ++i) {
        half  h;
        float sign    = 1;
        float logBase = pow(2.7182818, 2.2);

        // map  NaN and inf to 0
        if ((i & 0x7c00) == 0x7c00) {
            toLinear[i]    = 0;
            continue;
        }

        //
        // _toLinear - assume i is NATIVE, but our output needs
        //             to get flipped to XDR
        //
        h.setBits(i);
        sign = 1;
        if ((float)h < 0) {
            sign = -1;
        } 

        if ( fabs( (float)h) <= 1.0 ) {
            h  = (half)(sign * pow((float)fabs((float)h), 2.2f));
        } else {
            h  = (half)(sign * pow(logBase, (float)(fabs((float)h) - 1.0)));
        }

        {
            char *tmp = (char *)(&toLinear[i]);

            Xdr::write <CharPtrIO> ( tmp,  h.bits());
        }
    }
    
    printf("test dwaCompressorToLinear[]\n");
    for (int i=0; i<65536; ++i)
        assert (toLinear[i] == OPENEXR_IMF_INTERNAL_NAMESPACE::dwaCompressorToLinear[i]);
}